

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O3

int32_t __thiscall
icu_63::SimpleDateFormat::matchQuarterString
          (SimpleDateFormat *this,UnicodeString *text,int32_t start,UCalendarDateFields field,
          UnicodeString *data,int32_t dataCount,Calendar *cal)

{
  int32_t iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  UnicodeString bestMatchName;
  UnicodeString local_70;
  
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00487e70;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  if (0 < dataCount) {
    uVar2 = 0;
    uVar3 = 0xffffffff;
    iVar4 = 0;
    do {
      iVar1 = matchStringWithOptionalDot(text,start,data);
      if (iVar4 < iVar1) {
        uVar3 = uVar2 & 0xffffffff;
        iVar4 = iVar1;
      }
      uVar2 = uVar2 + 1;
      data = data + 1;
    } while ((uint)dataCount != uVar2);
    if (-1 < (int)uVar3) {
      Calendar::set(cal,field,(int)uVar3 * 3);
      iVar1 = start + iVar4;
      goto LAB_002c7236;
    }
  }
  iVar1 = -start;
LAB_002c7236:
  icu_63::UnicodeString::~UnicodeString(&local_70);
  return iVar1;
}

Assistant:

int32_t SimpleDateFormat::matchQuarterString(const UnicodeString& text,
                              int32_t start,
                              UCalendarDateFields field,
                              const UnicodeString* data,
                              int32_t dataCount,
                              Calendar& cal) const
{
    int32_t i = 0;
    int32_t count = dataCount;

    // There may be multiple strings in the data[] array which begin with
    // the same prefix (e.g., Cerven and Cervenec (June and July) in Czech).
    // We keep track of the longest match, and return that.  Note that this
    // unfortunately requires us to test all array elements.
    int32_t bestMatchLength = 0, bestMatch = -1;
    UnicodeString bestMatchName;

    for (; i < count; ++i) {
        int32_t matchLength = 0;
        if ((matchLength = matchStringWithOptionalDot(text, start, data[i])) > bestMatchLength) {
            bestMatchLength = matchLength;
            bestMatch = i;
        }
    }

    if (bestMatch >= 0) {
        cal.set(field, bestMatch * 3);
        return start + bestMatchLength;
    }

    return -start;
}